

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dreadtriple.c
# Opt level: O2

void dreadtriple(int *m,int *n,int_t *nonz,double **nzval,int_t **rowind,int_t **colptr)

{
  uint uVar1;
  uint uVar2;
  double *pdVar3;
  int_t *piVar4;
  int *piVar5;
  bool bVar6;
  int iVar7;
  undefined8 *addr;
  uint *addr_00;
  uint *addr_01;
  ulong uVar8;
  int iVar9;
  long lVar10;
  undefined8 *puVar11;
  uint *puVar12;
  uint *puVar13;
  uint uVar14;
  
  __isoc99_scanf("%d%d");
  uVar14 = *n;
  *m = uVar14;
  printf("m %d, n %d, nonz %ld\n",(ulong)uVar14,(ulong)uVar14,(long)*nonz);
  dallocateA(*n,*nonz,nzval,rowind,colptr);
  pdVar3 = *nzval;
  piVar4 = *rowind;
  piVar5 = *colptr;
  addr = (undefined8 *)superlu_malloc((long)*nonz << 3);
  addr_00 = (uint *)int32Malloc(*nonz);
  addr_01 = (uint *)int32Malloc(*nonz);
  for (lVar10 = 0; lVar10 < *n; lVar10 = lVar10 + 1) {
    piVar5[lVar10] = 0;
  }
  uVar14 = 0;
  bVar6 = false;
  puVar11 = addr;
  puVar12 = addr_00;
  puVar13 = addr_01;
  do {
    if (*nonz <= (int)uVar14) {
      *nonz = uVar14;
      iVar7 = *piVar5;
      *piVar5 = 0;
      iVar9 = 0;
      for (lVar10 = 1; lVar10 < *n; lVar10 = lVar10 + 1) {
        iVar9 = iVar9 + iVar7;
        iVar7 = piVar5[lVar10];
        piVar5[lVar10] = iVar9;
      }
      for (lVar10 = 0; lVar10 < *nonz; lVar10 = lVar10 + 1) {
        uVar14 = addr_01[lVar10];
        iVar7 = piVar5[(int)uVar14];
        piVar4[iVar7] = addr_00[lVar10];
        pdVar3[iVar7] = (double)addr[lVar10];
        piVar5[(int)uVar14] = piVar5[(int)uVar14] + 1;
      }
      for (uVar8 = (ulong)(uint)*n; 0 < (int)uVar8; uVar8 = uVar8 - 1) {
        piVar5[uVar8] = piVar5[uVar8 - 1];
      }
      *piVar5 = 0;
      superlu_free(addr);
      superlu_free(addr_00);
      superlu_free(addr_01);
      return;
    }
    __isoc99_scanf("%d%d%lf\n",puVar12,puVar13,puVar11);
    if (uVar14 == 0) {
      if ((*addr_00 != 0) && (*addr_01 != 0)) {
        puts("triplet file: row/col indices are one-based.");
        goto LAB_00105512;
      }
      puts("triplet file: row/col indices are zero-based.");
      bVar6 = true;
    }
    else {
LAB_00105512:
      if (!bVar6) {
        *puVar12 = *puVar12 - 1;
        *puVar13 = *puVar13 - 1;
        bVar6 = false;
      }
    }
    uVar1 = *puVar12;
    if ((int)uVar1 < 0) {
      uVar8 = (ulong)*puVar13;
LAB_00105653:
      fprintf(_stderr,"nz %d, (%d, %d) = %e out of bound, removed\n",*puVar11,(ulong)uVar14,
              (ulong)uVar1,uVar8);
      exit(-1);
    }
    uVar2 = *puVar13;
    uVar8 = (ulong)uVar2;
    if (((*m <= (int)uVar1) || ((int)uVar2 < 0)) || (*n <= (int)uVar2)) goto LAB_00105653;
    piVar5[uVar8] = piVar5[uVar8] + 1;
    uVar14 = uVar14 + 1;
    puVar11 = puVar11 + 1;
    puVar13 = puVar13 + 1;
    puVar12 = puVar12 + 1;
  } while( true );
}

Assistant:

void
dreadtriple(int *m, int *n, int_t *nonz,
	    double **nzval, int_t **rowind, int_t **colptr)
{
/*
 * Output parameters
 * =================
 *   (a,asub,xa): asub[*] contains the row subscripts of nonzeros
 *	in columns of matrix A; a[*] the numerical values;
 *	row i of A is given by a[k],k=xa[i],...,xa[i+1]-1.
 *
 */
    int    j, k, jsize, nnz, nz;
    double *a, *val;
    int_t  *asub, *xa;
    int    *row, *col;
    int    zero_base = 0;

    /*  Matrix format:
     *    First line:  #rows, #cols, #non-zero
     *    Triplet in the rest of lines:
     *                 row, col, value
     */

#ifdef _LONGINT
    scanf("%d%lld", n, nonz);
#else
    scanf("%d%d", n, nonz);
#endif    
    *m = *n;
    printf("m %d, n %d, nonz %ld\n", *m, *n, (long) *nonz);
    dallocateA(*n, *nonz, nzval, rowind, colptr); /* Allocate storage */
    a    = *nzval;
    asub = *rowind;
    xa   = *colptr;

    val = (double *) SUPERLU_MALLOC(*nonz * sizeof(double));
    row = int32Malloc(*nonz);
    col = int32Malloc(*nonz);

    for (j = 0; j < *n; ++j) xa[j] = 0;

    /* Read into the triplet array from a file */
    for (nnz = 0, nz = 0; nnz < *nonz; ++nnz) {
    
	scanf("%d%d%lf\n", &row[nz], &col[nz], &val[nz]);

        if ( nnz == 0 ) { /* first nonzero */
	    if ( row[0] == 0 || col[0] == 0 ) {
		zero_base = 1;
		printf("triplet file: row/col indices are zero-based.\n");
	    } else
		printf("triplet file: row/col indices are one-based.\n");
        }

        if ( !zero_base ) { 
 	  /* Change to 0-based indexing. */
	  --row[nz];
	  --col[nz];
        }

	if (row[nz] < 0 || row[nz] >= *m || col[nz] < 0 || col[nz] >= *n
	    /*|| val[nz] == 0.*/) {
	    fprintf(stderr, "nz %d, (%d, %d) = %e out of bound, removed\n",
		    nz, row[nz], col[nz], val[nz]);
	    exit(-1);
	} else {
	    ++xa[col[nz]];
	    ++nz;
	}
    }

    *nonz = nz;

    /* Initialize the array of column pointers */
    k = 0;
    jsize = xa[0];
    xa[0] = 0;
    for (j = 1; j < *n; ++j) {
	k += jsize;
	jsize = xa[j];
	xa[j] = k;
    }
    
    /* Copy the triplets into the column oriented storage */
    for (nz = 0; nz < *nonz; ++nz) {
	j = col[nz];
	k = xa[j];
	asub[k] = row[nz];
	a[k] = val[nz];
	++xa[j];
    }

    /* Reset the column pointers to the beginning of each column */
    for (j = *n; j > 0; --j)
	xa[j] = xa[j-1];
    xa[0] = 0;

    SUPERLU_FREE(val);
    SUPERLU_FREE(row);
    SUPERLU_FREE(col);

#ifdef CHK_INPUT
    {
	int i;
	for (i = 0; i < *n; i++) {
	    printf("Col %d, xa %d\n", i, xa[i]);
	    for (k = xa[i]; k < xa[i+1]; k++)
		printf("%d\t%16.10f\n", asub[k], a[k]);
	}
    }
#endif

}